

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O1

int db_getinfo(lua_State *L)

{
  int iVar1;
  lua_State *to;
  char *pcVar2;
  lua_Integer lVar3;
  char *pcVar4;
  int idx;
  int arg;
  lua_Debug ar;
  int local_a4;
  lua_Debug local_a0;
  
  to = getthread(L,&local_a4);
  pcVar2 = luaL_optlstring(L,local_a4 + 2,"flnSu",(size_t *)0x0);
  idx = local_a4 + 1;
  iVar1 = lua_isnumber(L,idx);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,idx);
    if (iVar1 != 6) {
      iVar1 = luaL_argerror(L,idx,"function or level expected");
      return iVar1;
    }
    lua_pushfstring(L,">%s",pcVar2);
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    lua_pushvalue(L,idx);
    lua_xmove(L,to,1);
  }
  else {
    lVar3 = lua_tointeger(L,idx);
    iVar1 = lua_getstack(to,(int)lVar3,&local_a0);
    if (iVar1 == 0) {
      lua_pushnil(L);
      return 1;
    }
  }
  iVar1 = lua_getinfo(to,pcVar2,&local_a0);
  if (iVar1 == 0) {
    iVar1 = luaL_argerror(L,local_a4 + 2,"invalid option");
  }
  else {
    lua_createtable(L,0,2);
    pcVar4 = strchr(pcVar2,0x53);
    if (pcVar4 != (char *)0x0) {
      lua_pushstring(L,local_a0.source);
      lua_setfield(L,-2,"source");
      lua_pushstring(L,local_a0.short_src);
      lua_setfield(L,-2,"short_src");
      lua_pushinteger(L,(long)local_a0.linedefined);
      lua_setfield(L,-2,"linedefined");
      lua_pushinteger(L,(long)local_a0.lastlinedefined);
      lua_setfield(L,-2,"lastlinedefined");
      lua_pushstring(L,local_a0.what);
      lua_setfield(L,-2,"what");
    }
    pcVar4 = strchr(pcVar2,0x6c);
    if (pcVar4 != (char *)0x0) {
      lua_pushinteger(L,(long)local_a0.currentline);
      lua_setfield(L,-2,"currentline");
    }
    pcVar4 = strchr(pcVar2,0x75);
    if (pcVar4 != (char *)0x0) {
      lua_pushinteger(L,(long)local_a0.nups);
      lua_setfield(L,-2,"nups");
    }
    pcVar4 = strchr(pcVar2,0x6e);
    if (pcVar4 != (char *)0x0) {
      lua_pushstring(L,local_a0.name);
      lua_setfield(L,-2,"name");
      lua_pushstring(L,local_a0.namewhat);
      lua_setfield(L,-2,"namewhat");
    }
    pcVar4 = strchr(pcVar2,0x4c);
    if (pcVar4 != (char *)0x0) {
      treatstackoption(L,to,"activelines");
    }
    pcVar2 = strchr(pcVar2,0x66);
    iVar1 = 1;
    if (pcVar2 != (char *)0x0) {
      treatstackoption(L,to,"func");
    }
  }
  return iVar1;
}

Assistant:

static int db_getinfo (lua_State *L) {
  lua_Debug ar;
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSu");
  if (lua_isnumber(L, arg+1)) {
    if (!lua_getstack(L1, (int)lua_tointeger(L, arg+1), &ar)) {
      lua_pushnil(L);  /* level out of range */
      return 1;
    }
  }
  else if (lua_isfunction(L, arg+1)) {
    lua_pushfstring(L, ">%s", options);
    options = lua_tostring(L, -1);
    lua_pushvalue(L, arg+1);
    lua_xmove(L, L1, 1);
  }
  else
    return luaL_argerror(L, arg+1, "function or level expected");
  if (!lua_getinfo(L1, options, &ar))
    return luaL_argerror(L, arg+2, "invalid option");
  lua_createtable(L, 0, 2);
  if (strchr(options, 'S')) {
    settabss(L, "source", ar.source);
    settabss(L, "short_src", ar.short_src);
    settabsi(L, "linedefined", ar.linedefined);
    settabsi(L, "lastlinedefined", ar.lastlinedefined);
    settabss(L, "what", ar.what);
  }
  if (strchr(options, 'l'))
    settabsi(L, "currentline", ar.currentline);
  if (strchr(options, 'u'))
    settabsi(L, "nups", ar.nups);
  if (strchr(options, 'n')) {
    settabss(L, "name", ar.name);
    settabss(L, "namewhat", ar.namewhat);
  }
  if (strchr(options, 'L'))
    treatstackoption(L, L1, "activelines");
  if (strchr(options, 'f'))
    treatstackoption(L, L1, "func");
  return 1;  /* return table */
}